

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall PlanTest::TestPoolWithDepthOne(PlanTest *this,char *test_case)

{
  Plan *this_00;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  Edge *pEVar5;
  Edge *pEVar6;
  allocator<char> local_71;
  string err;
  string local_50;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_StateTestWithBuiltinRules).state_,test_case,(ManifestParserOptions)0x0);
  if (iVar1 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"out1",(allocator<char> *)&local_50);
  pNVar4 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&err);
  pNVar4->dirty_ = true;
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"out2",(allocator<char> *)&local_50);
  pNVar4 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&err);
  pNVar4->dirty_ = true;
  std::__cxx11::string::~string((string *)&err);
  pTVar2 = g_current_test;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"out1",&local_71);
  pNVar4 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&local_50);
  this_00 = &this->plan_;
  bVar3 = Plan::AddTarget(this_00,pNVar4,&err);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
             ,0xcd,"plan_.AddTarget(GetNode(\"out1\"), &err)");
  std::__cxx11::string::~string((string *)&local_50);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&err);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                     ,0xce,"\"\" == err");
  pTVar2 = g_current_test;
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"out2",&local_71);
    pNVar4 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&local_50);
    bVar3 = Plan::AddTarget(this_00,pNVar4,&err);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0xcf,"plan_.AddTarget(GetNode(\"out2\"), &err)");
    std::__cxx11::string::~string((string *)&local_50);
    pTVar2 = g_current_test;
    bVar3 = std::operator==("",&err);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0xd0,"\"\" == err");
    if ((bVar3) &&
       (bVar3 = testing::Test::Check
                          (g_current_test,
                           0 < (this->plan_).command_edges_ && 0 < (this->plan_).wanted_edges_,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0xd1,"plan_.more_to_do()"), bVar3)) {
      pEVar5 = Plan::FindWork(this_00);
      bVar3 = testing::Test::Check
                        (g_current_test,pEVar5 != (Edge *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0xd4,"edge");
      pTVar2 = g_current_test;
      if (bVar3) {
        bVar3 = std::operator==("in",&(*(pEVar5->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_start)->env_path_);
        bVar3 = testing::Test::Check
                          (pTVar2,bVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0xd5,"\"in\" == edge->inputs_[0]->path()");
        pTVar2 = g_current_test;
        if (bVar3) {
          bVar3 = std::operator==("out1",&(*(pEVar5->outputs_).
                                            super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->env_path_);
          bVar3 = testing::Test::Check
                            (pTVar2,bVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                             ,0xd6,"\"out1\" == edge->outputs_[0]->path()");
          pTVar2 = g_current_test;
          if (bVar3) {
            pEVar6 = Plan::FindWork(this_00);
            bVar3 = testing::Test::Check
                              (pTVar2,pEVar6 == (Edge *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                               ,0xd9,"plan_.FindWork()");
            if (bVar3) {
              Plan::EdgeFinished(this_00,pEVar5,kEdgeSucceeded,&err);
              pTVar2 = g_current_test;
              bVar3 = std::operator==("",&err);
              bVar3 = testing::Test::Check
                                (pTVar2,bVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                 ,0xdc,"\"\" == err");
              if (bVar3) {
                pEVar5 = Plan::FindWork(this_00);
                bVar3 = testing::Test::Check
                                  (g_current_test,pEVar5 != (Edge *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                   ,0xdf,"edge");
                pTVar2 = g_current_test;
                if (bVar3) {
                  bVar3 = std::operator==("in",&(*(pEVar5->inputs_).
                                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                env_path_);
                  bVar3 = testing::Test::Check
                                    (pTVar2,bVar3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                     ,0xe0,"\"in\" == edge->inputs_[0]->path()");
                  pTVar2 = g_current_test;
                  if (bVar3) {
                    bVar3 = std::operator==("out2",&(*(pEVar5->outputs_).
                                                                                                            
                                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  env_path_);
                    bVar3 = testing::Test::Check
                                      (pTVar2,bVar3,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                       ,0xe1,"\"out2\" == edge->outputs_[0]->path()");
                    pTVar2 = g_current_test;
                    if (bVar3) {
                      pEVar6 = Plan::FindWork(this_00);
                      bVar3 = testing::Test::Check
                                        (pTVar2,pEVar6 == (Edge *)0x0,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                         ,0xe3,"plan_.FindWork()");
                      if (bVar3) {
                        Plan::EdgeFinished(this_00,pEVar5,kEdgeSucceeded,&err);
                        pTVar2 = g_current_test;
                        bVar3 = std::operator==("",&err);
                        bVar3 = testing::Test::Check
                                          (pTVar2,bVar3,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                           ,0xe6,"\"\" == err");
                        if ((bVar3) &&
                           (bVar3 = testing::Test::Check
                                              (g_current_test,
                                               (this->plan_).command_edges_ < 1 ||
                                               (this->plan_).wanted_edges_ < 1,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                               ,0xe8,"plan_.more_to_do()"), bVar3)) {
                          pEVar5 = Plan::FindWork(this_00);
                          bVar3 = testing::Test::Check
                                            (g_current_test,pEVar5 == (Edge *)0x0,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                             ,0xea,"0 == edge");
                          if (bVar3) goto LAB_0011edda;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0011edda:
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

void PlanTest::TestPoolWithDepthOne(const char* test_case) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_, test_case));
  GetNode("out1")->MarkDirty();
  GetNode("out2")->MarkDirty();
  string err;
  EXPECT_TRUE(plan_.AddTarget(GetNode("out1"), &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(plan_.AddTarget(GetNode("out2"), &err));
  ASSERT_EQ("", err);
  ASSERT_TRUE(plan_.more_to_do());

  Edge* edge = plan_.FindWork();
  ASSERT_TRUE(edge);
  ASSERT_EQ("in",  edge->inputs_[0]->path());
  ASSERT_EQ("out1", edge->outputs_[0]->path());

  // This will be false since poolcat is serialized
  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_TRUE(edge);
  ASSERT_EQ("in", edge->inputs_[0]->path());
  ASSERT_EQ("out2", edge->outputs_[0]->path());

  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  ASSERT_FALSE(plan_.more_to_do());
  edge = plan_.FindWork();
  ASSERT_EQ(0, edge);
}